

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_typed_token_timesamples<tinyusdz::Visibility>
                   (string *__return_storage_ptr__,TypedTimeSamples<tinyusdz::Visibility> *v,
                   uint32_t indent)

{
  long *plVar1;
  pointer pSVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  long *plVar6;
  uint32_t n;
  Visibility extraout_EDX;
  Visibility extraout_EDX_00;
  Visibility v_00;
  undefined4 in_register_00000014;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  undefined8 extraout_RDX_01;
  ulong uVar8;
  long lVar9;
  stringstream ss;
  string local_248;
  pprint *local_228;
  long *local_220;
  long local_218;
  long local_210 [2];
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_228 = (pprint *)CONCAT44(in_register_00000014,indent);
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{\n",2);
  uVar7 = extraout_RDX;
  if (v->_dirty == true) {
    TypedTimeSamples<tinyusdz::Visibility>::update(v);
    uVar7 = extraout_RDX_00;
  }
  n = (uint32_t)uVar7;
  if ((v->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (v->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar3 = (int)local_228;
    lVar9 = 0;
    uVar8 = 0;
    do {
      pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)(iVar3 + 1),(uint32_t)uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
      poVar5 = std::ostream::_M_insert<double>
                         (*(double *)
                           ((long)&((v->_samples).
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->t + lVar9));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
      v_00 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        v_00 = extraout_EDX_00;
      }
      pSVar2 = (v->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((&pSVar2->blocked)[lVar9] == true) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"None",4);
      }
      else {
        to_string_abi_cxx11_
                  (&local_1d8,(tinyusdz *)(ulong)*(uint *)((long)&pSVar2->value + lVar9),v_00);
        local_220 = local_210;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"\"","");
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,local_220,local_218 + (long)local_220);
        std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1d8._M_dataplus._M_p);
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_220);
        local_200 = &local_1f0;
        plVar1 = plVar6 + 2;
        if ((long *)*plVar6 == plVar1) {
          local_1f0 = *plVar1;
          lStack_1e8 = plVar6[3];
        }
        else {
          local_1f0 = *plVar1;
          local_200 = (long *)*plVar6;
        }
        local_1f8 = plVar6[1];
        *plVar6 = (long)plVar1;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_200,local_1f8);
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_220 != local_210) {
          operator_delete(local_220,local_210[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",\n",2);
      n = (uint32_t)extraout_RDX_01;
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x10;
      uVar7 = extraout_RDX_01;
    } while (uVar8 < (ulong)((long)(v->_samples).
                                   super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(v->_samples).
                                   super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Visibility>::Sample>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  pprint::Indent_abi_cxx11_(&local_248,local_228,n);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  psVar4 = local_1e0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string print_typed_token_timesamples(const TypedTimeSamples<T> &v,
                                          const uint32_t indent = 0) {
  std::stringstream ss;

  ss << "{\n";

  const auto &samples = v.get_samples();

  for (size_t i = 0; i < samples.size(); i++) {
    ss << pprint::Indent(indent + 1) << samples[i].t << ": ";
    if (samples[i].blocked) {
      ss << "None";
    } else {
      ss << quote(to_string(samples[i].value));
    }
    ss << ",\n";
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}